

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int DoInclude(int dummy)

{
  char *__src;
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *__s;
  int iVar5;
  size_t sVar6;
  bool bVar7;
  char *local_68;
  size_t pathlen;
  char *path;
  char *lastSlash;
  char *savepatchname;
  char *savepatchpt;
  char *savepatchfile;
  int savepatchsize;
  int savepversion;
  int savedversion;
  char *data;
  int dummy_local;
  
  if (including) {
    Printf("Sorry, can\'t nest includes\n");
    data._4_4_ = GetLine();
  }
  else {
    iVar5 = strncasecmp(Line2,"notext",6);
    if (((iVar5 == 0) && (Line2[6] != '\0')) && (iVar5 = isspace((int)Line2[6]), iVar5 != 0)) {
      includenotext = true;
      Line2 = skipwhite(Line2 + 7);
    }
    stripwhite(Line2);
    if (*Line2 == '\"') {
      Line2 = Line2 + 1;
      _savepversion = Line2;
      while( true ) {
        bVar7 = false;
        if (*_savepversion != '\0') {
          bVar7 = *_savepversion != '\"';
        }
        if (!bVar7) break;
        _savepversion = _savepversion + 1;
      }
      *_savepversion = '\0';
    }
    __s = Line2;
    if (*Line2 == '\0') {
      Printf("Include directive is missing filename\n");
    }
    else {
      DPrintf(4,"Including %s\n",Line2);
      pcVar4 = PatchPt;
      iVar3 = dversion;
      iVar2 = pversion;
      pcVar1 = PatchFile;
      __src = PatchName;
      iVar5 = PatchSize;
      including = true;
      if (PatchName == (char *)0x0) {
        local_68 = (char *)0x0;
      }
      else {
        local_68 = strrchr(PatchName,0x2f);
      }
      pathlen = (size_t)__s;
      if (local_68 != (char *)0x0) {
        sVar6 = strlen(__s);
        pathlen = (size_t)operator_new__((ulong)(local_68 + (sVar6 - (long)__src) + 2));
        strncpy((char *)pathlen,__src,(size_t)(local_68 + (1 - (long)__src)));
        strcpy((char *)(pathlen + (long)(local_68 + (1 - (long)__src))),__s);
        bVar7 = FileExists((char *)pathlen);
        if (!bVar7) {
          if ((char *)pathlen != (char *)0x0) {
            operator_delete__((void *)pathlen);
          }
          pathlen = (size_t)__s;
        }
      }
      D_LoadDehFile((char *)pathlen);
      if ((__s != (char *)pathlen) && (pathlen != 0)) {
        operator_delete__((void *)pathlen);
      }
      DPrintf(4,"Done with include\n");
      PatchSize = iVar5;
      PatchName = __src;
      PatchFile = pcVar1;
      pversion = iVar2;
      dversion = iVar3;
      PatchPt = pcVar4;
    }
    including = false;
    includenotext = false;
    data._4_4_ = GetLine();
  }
  return data._4_4_;
}

Assistant:

static int DoInclude (int dummy)
{
	char *data;
	int savedversion, savepversion, savepatchsize;
	char *savepatchfile, *savepatchpt, *savepatchname;

	if (including)
	{
		Printf ("Sorry, can't nest includes\n");
		return GetLine();
	}

	if (strnicmp (Line2, "notext", 6) == 0 && Line2[6] != 0 && isspace(Line2[6]))
	{
		includenotext = true;
		Line2 = skipwhite (Line2+7);
	}

	stripwhite (Line2);
	if (*Line2 == '\"')
	{
		data = ++Line2;
		while (*data && *data != '\"')
			data++;
		*data = 0;
	}

	if (*Line2 == 0)
	{
		Printf ("Include directive is missing filename\n");
	}
	else
	{
		data = Line2;
		DPrintf (DMSG_SPAMMY, "Including %s\n", data);
		savepatchname = PatchName;
		savepatchfile = PatchFile;
		savepatchpt = PatchPt;
		savepatchsize = PatchSize;
		savedversion = dversion;
		savepversion = pversion;
		including = true;

		// Try looking for the included file in the same directory
		// as the patch before looking in the current file.
		const char *lastSlash = savepatchname ? strrchr (savepatchname, '/') : NULL;
		char *path = data;

		if (lastSlash != NULL)
		{
			size_t pathlen = lastSlash - savepatchname + strlen (data) + 2;
			path = new char[pathlen];
			strncpy (path, savepatchname, (lastSlash - savepatchname) + 1);
			strcpy (path + (lastSlash - savepatchname) + 1, data);
			if (!FileExists (path))
			{
				delete[] path;
				path = data;
			}
		}

		D_LoadDehFile(path);

		if (data != path)
		{
			delete[] path;
		}

		DPrintf (DMSG_SPAMMY, "Done with include\n");
		PatchName = savepatchname;
		PatchFile = savepatchfile;
		PatchPt = savepatchpt;
		PatchSize = savepatchsize;
		dversion = savedversion;
		pversion = savepversion;
	}

	including = false;
	includenotext = false;
	return GetLine();
}